

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

int get_qzbin_factor(int q,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int in_ESI;
  int in_EDI;
  int quant;
  aom_bit_depth_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_4;
  
  iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                           in_stack_ffffffffffffffd8);
  if (in_ESI == 8) {
    if (in_EDI == 0) {
      local_18 = 0x40;
    }
    else {
      local_18 = 0x50;
      if (iVar1 < 0x94) {
        local_18 = 0x54;
      }
    }
    local_4 = local_18;
  }
  else if (in_ESI == 10) {
    if (in_EDI == 0) {
      local_1c = 0x40;
    }
    else {
      local_1c = 0x50;
      if (iVar1 < 0x250) {
        local_1c = 0x54;
      }
    }
    local_4 = local_1c;
  }
  else if (in_ESI == 0xc) {
    if (in_EDI == 0) {
      local_4 = 0x40;
    }
    else {
      local_4 = 0x50;
      if (iVar1 < 0x940) {
        local_4 = 0x54;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int get_qzbin_factor(int q, aom_bit_depth_t bit_depth) {
  const int quant = av1_dc_quant_QTX(q, 0, bit_depth);
  switch (bit_depth) {
    case AOM_BITS_8: return q == 0 ? 64 : (quant < 148 ? 84 : 80);
    case AOM_BITS_10: return q == 0 ? 64 : (quant < 592 ? 84 : 80);
    case AOM_BITS_12: return q == 0 ? 64 : (quant < 2368 ? 84 : 80);
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
}